

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall slang::ast::Compilation::noteCannotCache(Compilation *this,Scope *scope)

{
  Symbol *pSVar1;
  Scope *in_RSI;
  Symbol *in_RDI;
  Compilation *unaff_retaddr;
  InstanceSideEffects *entry;
  Symbol *symbol;
  Scope *currScope;
  Symbol *in_stack_ffffffffffffffd8;
  Scope *local_18;
  
  local_18 = in_RSI;
  do {
    pSVar1 = Scope::asSymbol(local_18);
    if (pSVar1->kind == InstanceBody) {
      in_stack_ffffffffffffffd8 = (Symbol *)getOrAddSideEffects(unaff_retaddr,in_RDI);
      if ((*(bool *)&in_stack_ffffffffffffffd8->indexInScope & 1U) != 0) {
        return;
      }
      *(bool *)&in_stack_ffffffffffffffd8->indexInScope = true;
    }
    local_18 = Symbol::getHierarchicalParent(in_stack_ffffffffffffffd8);
  } while (local_18 != (Scope *)0x0);
  return;
}

Assistant:

void Compilation::noteCannotCache(const Scope& scope) {
    auto currScope = &scope;
    do {
        auto& symbol = currScope->asSymbol();
        if (symbol.kind == SymbolKind::InstanceBody) {
            auto& entry = getOrAddSideEffects(symbol);
            if (entry.cannotCache)
                break;

            entry.cannotCache = true;
        }

        currScope = symbol.getHierarchicalParent();
    } while (currScope);
}